

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gameclient.cpp
# Opt level: O2

int __thiscall CGameClient::GetClientID(CGameClient *this,char *pName)

{
  int iVar1;
  CClientData *a;
  int i;
  ulong uVar2;
  
  a = this->m_aClients;
  uVar2 = 0;
  while( true ) {
    if (uVar2 == 0x40) {
      return -1;
    }
    if (((a->m_Active == true) && (uVar2 != (uint)this->m_LocalClientID)) &&
       (iVar1 = str_comp(a->m_aName,pName), iVar1 == 0)) break;
    uVar2 = uVar2 + 1;
    a = a + 1;
  }
  return (int)uVar2;
}

Assistant:

int CGameClient::GetClientID(const char *pName)
{
	for(int i = 0; i < MAX_CLIENTS; i++)
	{
		if(!m_aClients[i].m_Active || i == m_LocalClientID) // skip local user
			continue;

		if(!str_comp(m_aClients[i].m_aName, pName))
			return i;
	}

	return -1;
}